

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 in_register_0000000c;
  secp256k1_fe *psVar8;
  ulong uVar9;
  secp256k1_ge *a;
  ulong uVar11;
  code *extraout_RDX;
  ulong uVar12;
  secp256k1_gej *a_00;
  ulong uVar13;
  secp256k1_scalar *ng;
  secp256k1_gej *r_00;
  ulong uVar14;
  ulong uVar15;
  secp256k1_gej *a_01;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  secp256k1_gej *psVar19;
  secp256k1_gej *a_02;
  ulong uVar20;
  secp256k1_strauss_state sStack_e30;
  secp256k1_scalar sStack_e18;
  secp256k1_gej sStack_df8;
  secp256k1_gej sStack_d60;
  secp256k1_ge sStack_cc8;
  secp256k1_fe asStack_c60 [8];
  secp256k1_ge asStack_ae0 [8];
  secp256k1_strauss_point_state sStack_7a0;
  secp256k1_gej *psStack_388;
  ulong uStack_380;
  ulong uStack_378;
  secp256k1_gej *psStack_370;
  secp256k1_modinv64_signed62 *psStack_368;
  code *pcStack_360;
  long lStack_350;
  ulong uStack_348;
  secp256k1_modinv64_signed62 sStack_340;
  secp256k1_fe sStack_318;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d8;
  ulong uStack_2d0;
  secp256k1_gej *psStack_2c8;
  secp256k1_gej *psStack_2c0;
  code *pcStack_2b8;
  ulong uStack_2b0;
  ulong uStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  secp256k1_gej *psStack_290;
  ulong uStack_288;
  secp256k1_gej *psStack_280;
  ulong uStack_278;
  secp256k1_fe *psStack_270;
  secp256k1_gej *psStack_268;
  undefined1 auStack_260 [56];
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  uint64_t uStack_210;
  int iStack_208;
  undefined1 auStack_200 [56];
  uint64_t uStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  uint64_t uStack_1b0;
  int iStack_1a8;
  int iStack_1a4;
  undefined1 auStack_1a0 [56];
  ulong uStack_168;
  ulong uStack_160;
  secp256k1_gej *psStack_158;
  ulong uStack_150;
  ulong uStack_148;
  secp256k1_fe sStack_140;
  secp256k1_fe sStack_110;
  secp256k1_fe sStack_e0;
  secp256k1_fe sStack_b0;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t uStack_70;
  uint64_t uStack_68;
  uint64_t uStack_60;
  int iStack_58;
  int iStack_54;
  undefined8 uVar10;
  
  psVar8 = (secp256k1_fe *)CONCAT44(in_register_0000000c,w);
  if ((n & 1U) == 0) {
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_0014f259:
    secp256k1_ecmult_table_get_ge_storage_cold_1();
  }
  else {
    if (n < -0x3fff) goto LAB_0014f259;
    if (n < 0x4000) {
      if (0 < n) {
        secp256k1_ge_from_storage(r,pre + (n - 1U >> 1));
        return;
      }
      secp256k1_ge_from_storage(r,pre + ((uint)~n >> 1));
      psVar8 = &r->y;
      secp256k1_fe_verify(psVar8);
      secp256k1_fe_verify_magnitude(psVar8,1);
      uVar2 = (r->y).n[1];
      uVar3 = (r->y).n[2];
      uVar4 = (r->y).n[3];
      (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
      (r->y).n[1] = 0x3ffffffffffffc - uVar2;
      (r->y).n[2] = 0x3ffffffffffffc - uVar3;
      (r->y).n[3] = 0x3ffffffffffffc - uVar4;
      (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
      (r->y).magnitude = 2;
      (r->y).normalized = 0;
      secp256k1_fe_verify(psVar8);
      return;
    }
  }
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  pcStack_2b8 = (code *)0x14f288;
  secp256k1_gej_verify((secp256k1_gej *)pre);
  pcStack_2b8 = (code *)0x14f290;
  secp256k1_ge_verify(a);
  pcStack_2b8 = (code *)0x14f298;
  secp256k1_fe_verify(psVar8);
  if (((secp256k1_gej *)pre)->infinity != 0) {
    ((secp256k1_gej *)r)->infinity = a->infinity;
    pcStack_2b8 = (code *)0x14f2c4;
    secp256k1_fe_sqr(&sStack_140,psVar8);
    pcStack_2b8 = (code *)0x14f2da;
    secp256k1_fe_mul(&sStack_b0,&sStack_140,psVar8);
    pcStack_2b8 = (code *)0x14f2e8;
    secp256k1_fe_mul(&r->x,&a->x,&sStack_140);
    pcStack_2b8 = (code *)0x14f2fb;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->y,&a->y,&sStack_b0);
    psVar19 = (secp256k1_gej *)&((secp256k1_gej *)r)->z;
    (((secp256k1_gej *)r)->z).n[0] = 1;
    (((secp256k1_gej *)r)->z).n[1] = 0;
    (((secp256k1_gej *)r)->z).n[2] = 0;
    (((secp256k1_gej *)r)->z).n[3] = 0;
    (((secp256k1_gej *)r)->z).n[4] = 0;
    (((secp256k1_gej *)r)->z).magnitude = 1;
    (((secp256k1_gej *)r)->z).normalized = 1;
LAB_0014f326:
    pcStack_2b8 = (code *)0x14f32b;
    secp256k1_fe_verify(&psVar19->x);
    pcStack_2b8 = (code *)0x14f333;
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  if (a->infinity != 0) {
    memcpy(r,pre,0x98);
    return;
  }
  psStack_270 = &((secp256k1_gej *)pre)->z;
  pcStack_2b8 = (code *)0x14f38a;
  secp256k1_fe_mul(&sStack_140,psStack_270,psVar8);
  pcStack_2b8 = (code *)0x14f39d;
  secp256k1_fe_sqr(&sStack_b0,&sStack_140);
  sStack_110.n[0] = (((secp256k1_gej *)pre)->x).n[0];
  sStack_110.n[1] = (((secp256k1_gej *)pre)->x).n[1];
  sStack_110.n[2] = (((secp256k1_gej *)pre)->x).n[2];
  sStack_110.n[3] = (((secp256k1_gej *)pre)->x).n[3];
  sStack_110.n[4] = (((secp256k1_gej *)pre)->x).n[4];
  sStack_110.magnitude = (((secp256k1_gej *)pre)->x).magnitude;
  sStack_110.normalized = (((secp256k1_gej *)pre)->x).normalized;
  pcStack_2b8 = (code *)0x14f3d2;
  secp256k1_fe_mul((secp256k1_fe *)auStack_200,&a->x,&sStack_b0);
  auStack_260._0_8_ = (((secp256k1_gej *)pre)->y).n[0];
  auStack_260._8_8_ = (((secp256k1_gej *)pre)->y).n[1];
  auStack_260._16_8_ = (((secp256k1_gej *)pre)->y).n[2];
  auStack_260._24_8_ = (((secp256k1_gej *)pre)->y).n[3];
  auStack_260._32_8_ = (((secp256k1_gej *)pre)->y).n[4];
  auStack_260._40_4_ = (((secp256k1_gej *)pre)->y).magnitude;
  auStack_260._44_4_ = (((secp256k1_gej *)pre)->y).normalized;
  pcStack_2b8 = (code *)0x14f413;
  psStack_2a0 = (secp256k1_gej *)pre;
  secp256k1_fe_mul(&sStack_e0,&a->y,&sStack_b0);
  pcStack_2b8 = (code *)0x14f426;
  secp256k1_fe_mul(&sStack_e0,&sStack_e0,&sStack_140);
  pcStack_2b8 = (code *)0x14f42e;
  secp256k1_fe_verify(&sStack_110);
  a_00 = (secp256k1_gej *)0x4;
  pcStack_2b8 = (code *)0x14f43b;
  secp256k1_fe_verify_magnitude(&sStack_110,4);
  psVar19 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - sStack_110.n[0]);
  uVar17 = 0x9ffffffffffff6 - sStack_110.n[1];
  uVar12 = 0x9ffffffffffff6 - sStack_110.n[2];
  a_01 = (secp256k1_gej *)(0x9ffffffffffff6 - sStack_110.n[3]);
  uStack_2a8 = 0x9fffffffffff6 - sStack_110.n[4];
  uStack_148 = 5;
  pcStack_2b8 = (code *)0x14f4a9;
  auStack_1a0._48_8_ = psVar19;
  uStack_168 = uVar17;
  uStack_160 = uVar12;
  psStack_158 = a_01;
  uStack_150 = uStack_2a8;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
  pcStack_2b8 = (code *)0x14f4b1;
  secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
  a_02 = (secp256k1_gej *)auStack_200;
  pcStack_2b8 = (code *)0x14f4c1;
  r_00 = a_02;
  secp256k1_fe_verify((secp256k1_fe *)a_02);
  if ((int)auStack_200._40_4_ < 0x1c) {
    psStack_268 = (secp256k1_gej *)((long)(psVar19->x).n + auStack_200._0_8_);
    uStack_278 = uVar17 + auStack_200._8_8_;
    uStack_288 = uVar12 + auStack_200._16_8_;
    psStack_280 = (secp256k1_gej *)((long)(a_01->x).n + auStack_200._24_8_);
    uStack_2a8 = uStack_2a8 + auStack_200._32_8_;
    uStack_148 = (ulong)(auStack_200._40_4_ + 5);
    pcStack_2b8 = (code *)0x14f541;
    auStack_1a0._48_8_ = psStack_268;
    uStack_168 = uStack_278;
    uStack_160 = uStack_288;
    psStack_158 = psStack_280;
    uStack_150 = uStack_2a8;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
    pcStack_2b8 = (code *)0x14f551;
    secp256k1_fe_verify(&sStack_e0);
    a_00 = (secp256k1_gej *)0x1;
    pcStack_2b8 = (code *)0x14f55e;
    secp256k1_fe_verify_magnitude(&sStack_e0,1);
    a_02 = (secp256k1_gej *)(0x3ffffbfffff0bc - sStack_e0.n[0]);
    psVar19 = (secp256k1_gej *)(0x3ffffffffffffc - sStack_e0.n[1]);
    uStack_2b0 = 0x3ffffffffffffc - sStack_e0.n[2];
    uVar12 = 0x3ffffffffffffc - sStack_e0.n[3];
    uVar17 = 0x3fffffffffffc - sStack_e0.n[4];
    auStack_1a0._40_8_ = 2;
    pcStack_2b8 = (code *)0x14f5ce;
    auStack_1a0._0_8_ = a_02;
    auStack_1a0._8_8_ = psVar19;
    auStack_1a0._16_8_ = uStack_2b0;
    auStack_1a0._24_8_ = uVar12;
    auStack_1a0._32_8_ = uVar17;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    pcStack_2b8 = (code *)0x14f5d6;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    a_01 = (secp256k1_gej *)auStack_260;
    pcStack_2b8 = (code *)0x14f5e3;
    r_00 = a_01;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    if (0x1e < (int)auStack_260._40_4_) goto LAB_0014fb0a;
    psStack_298 = (secp256k1_gej *)((long)(a_02->x).n + auStack_260._0_8_);
    psStack_290 = (secp256k1_gej *)((long)(psVar19->x).n + auStack_260._8_8_);
    uVar20 = uStack_2b0 + auStack_260._16_8_;
    uStack_2b0 = uVar12 + auStack_260._24_8_;
    uVar12 = uVar17 + auStack_260._32_8_;
    uVar17 = 0x1000003d0;
    auStack_1a0._44_4_ = 0;
    auStack_1a0._40_4_ = auStack_260._40_4_ + 2;
    pcStack_2b8 = (code *)0x14f666;
    auStack_1a0._0_8_ = psStack_298;
    auStack_1a0._8_8_ = psStack_290;
    auStack_1a0._16_8_ = uVar20;
    auStack_1a0._24_8_ = uStack_2b0;
    auStack_1a0._32_8_ = uVar12;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    pcStack_2b8 = (code *)0x14f673;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_1a0 + 0x30));
    uVar6 = (uStack_2a8 >> 0x30) * 0x1000003d1 + (long)psStack_268;
    if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
      uVar14 = uStack_278 + (uVar6 >> 0x34);
      uVar9 = (uVar14 >> 0x34) + uStack_288;
      uVar11 = (long)(psStack_280->x).n + (uVar9 >> 0x34);
      uVar13 = (uVar11 >> 0x34) + (uStack_2a8 & 0xffffffffffff);
      if ((((uVar14 | uVar6 | uVar9 | uVar11) & 0xfffffffffffff) == 0 && uVar13 == 0) ||
         (((uVar6 | 0x1000003d0) & uVar14 & uVar9 & uVar11 & (uVar13 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        pcStack_2b8 = (code *)0x14fa36;
        secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
        uVar17 = (uVar12 >> 0x30) * 0x1000003d1 + (long)psStack_298;
        if (((uVar17 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar17 & 0xfffffffffffff) == 0)) {
          uVar9 = (long)(psStack_290->x).n + (uVar17 >> 0x34);
          uVar20 = (uVar9 >> 0x34) + uVar20;
          uVar6 = (uVar20 >> 0x34) + uStack_2b0;
          uVar12 = (uVar6 >> 0x34) + (uVar12 & 0xffffffffffff);
          if ((((uVar9 | uVar17 | uVar20 | uVar6) & 0xfffffffffffff) == 0 && uVar12 == 0) ||
             (((uVar17 | 0x1000003d0) & uVar9 & uVar20 & uVar6 & (uVar12 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            pcStack_2b8 = (code *)0x14fb00;
            secp256k1_gej_double_var((secp256k1_gej *)r,psStack_2a0,(secp256k1_fe *)0x0);
            return;
          }
        }
        pcStack_2b8 = (code *)0x14faec;
        secp256k1_gej_set_infinity((secp256k1_gej *)r);
        return;
      }
    }
    ((secp256k1_gej *)r)->infinity = 0;
    a_02 = (secp256k1_gej *)(auStack_1a0 + 0x30);
    pcStack_2b8 = (code *)0x14f75c;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,psStack_270,(secp256k1_fe *)a_02);
    psVar19 = (secp256k1_gej *)&stack0xffffffffffffff80;
    pcStack_2b8 = (code *)0x14f76f;
    secp256k1_fe_sqr((secp256k1_fe *)psVar19,(secp256k1_fe *)a_02);
    pcStack_2b8 = (code *)0x14f777;
    secp256k1_fe_verify((secp256k1_fe *)psVar19);
    pcStack_2b8 = (code *)0x14f784;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar19,1);
    uStack_80 = 0x3ffffbfffff0bc - uStack_80;
    uStack_78 = 0x3ffffffffffffc - uStack_78;
    uStack_70 = 0x3ffffffffffffc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    uStack_60 = 0x3fffffffffffc - uStack_60;
    iStack_58 = 2;
    iStack_54 = 0;
    pcStack_2b8 = (code *)0x14f7cc;
    secp256k1_fe_verify((secp256k1_fe *)psVar19);
    a_01 = (secp256k1_gej *)(auStack_260 + 0x30);
    pcStack_2b8 = (code *)0x14f7e2;
    secp256k1_fe_mul((secp256k1_fe *)a_01,(secp256k1_fe *)psVar19,(secp256k1_fe *)a_02);
    pcStack_2b8 = (code *)0x14f7fa;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_200 + 0x30),&sStack_110,(secp256k1_fe *)psVar19);
    a_00 = (secp256k1_gej *)auStack_1a0;
    pcStack_2b8 = (code *)0x14f80a;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_00);
    pcStack_2b8 = (code *)0x14f812;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x14f81a;
    r_00 = a_01;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    iVar5 = iStack_208 + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_0014fb0f;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_260._48_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + uStack_228;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + uStack_220;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + uStack_218;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + uStack_210;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    pcStack_2b8 = (code *)0x14f86d;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x14f875;
    secp256k1_fe_verify(&r->x);
    psVar19 = (secp256k1_gej *)(auStack_200 + 0x30);
    pcStack_2b8 = (code *)0x14f885;
    r_00 = psVar19;
    secp256k1_fe_verify((secp256k1_fe *)psVar19);
    iVar5 = iStack_1a8 + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_0014fb14;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    psVar19 = (secp256k1_gej *)(auStack_200 + 0x30);
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_200._48_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + uStack_1c8;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + uStack_1c0;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + uStack_1b8;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + uStack_1b0;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    pcStack_2b8 = (code *)0x14f8d4;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x14f8dc;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x14f8e4;
    r_00 = psVar19;
    secp256k1_fe_verify((secp256k1_fe *)psVar19);
    iVar5 = iStack_1a8 + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar5) goto LAB_0014fb19;
    uVar2 = (((secp256k1_gej *)r)->x).n[1];
    uVar3 = (((secp256k1_gej *)r)->x).n[2];
    uVar4 = (((secp256k1_gej *)r)->x).n[3];
    psVar19 = (secp256k1_gej *)(auStack_200 + 0x30);
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_200._48_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar2 + uStack_1c8;
    (((secp256k1_gej *)r)->x).n[2] = uVar3 + uStack_1c0;
    (((secp256k1_gej *)r)->x).n[3] = uVar4 + uStack_1b8;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + uStack_1b0;
    (((secp256k1_gej *)r)->x).magnitude = iVar5;
    (((secp256k1_gej *)r)->x).normalized = 0;
    pcStack_2b8 = (code *)0x14f933;
    secp256k1_fe_verify(&r->x);
    pcStack_2b8 = (code *)0x14f93b;
    secp256k1_fe_verify((secp256k1_fe *)psVar19);
    pcStack_2b8 = (code *)0x14f943;
    r_00 = (secp256k1_gej *)r;
    secp256k1_fe_verify(&r->x);
    iVar5 = (((secp256k1_gej *)r)->x).magnitude + iStack_1a8;
    if (iVar5 < 0x21) {
      auStack_200._48_8_ = (((secp256k1_gej *)r)->x).n[0] + auStack_200._48_8_;
      uStack_1c8 = (((secp256k1_gej *)r)->x).n[1] + uStack_1c8;
      uStack_1c0 = (((secp256k1_gej *)r)->x).n[2] + uStack_1c0;
      uStack_1b8 = (((secp256k1_gej *)r)->x).n[3] + uStack_1b8;
      uStack_1b0 = uStack_1b0 + (((secp256k1_gej *)r)->x).n[4];
      iStack_1a4 = 0;
      pcStack_2b8 = (code *)0x14f996;
      iStack_1a8 = iVar5;
      secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
      psVar19 = (secp256k1_gej *)&((secp256k1_gej *)r)->y;
      pcStack_2b8 = (code *)0x14f9ad;
      secp256k1_fe_mul((secp256k1_fe *)psVar19,(secp256k1_fe *)(auStack_200 + 0x30),
                       (secp256k1_fe *)auStack_1a0);
      a_02 = (secp256k1_gej *)(auStack_260 + 0x30);
      pcStack_2b8 = (code *)0x14f9c5;
      a_00 = a_02;
      secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,(secp256k1_fe *)auStack_260);
      pcStack_2b8 = (code *)0x14f9cd;
      secp256k1_fe_verify((secp256k1_fe *)psVar19);
      pcStack_2b8 = (code *)0x14f9d5;
      r_00 = a_02;
      secp256k1_fe_verify((secp256k1_fe *)a_02);
      iStack_208 = iStack_208 + (((secp256k1_gej *)r)->y).magnitude;
      if (iStack_208 < 0x21) {
        uVar2 = (((secp256k1_gej *)r)->y).n[1];
        uVar3 = (((secp256k1_gej *)r)->y).n[2];
        uVar4 = (((secp256k1_gej *)r)->y).n[3];
        (((secp256k1_gej *)r)->y).n[0] = (((secp256k1_gej *)r)->y).n[0] + auStack_260._48_8_;
        (((secp256k1_gej *)r)->y).n[1] = uVar2 + uStack_228;
        (((secp256k1_gej *)r)->y).n[2] = uVar3 + uStack_220;
        (((secp256k1_gej *)r)->y).n[3] = uVar4 + uStack_218;
        puVar1 = (((secp256k1_gej *)r)->y).n + 4;
        *puVar1 = *puVar1 + uStack_210;
        (((secp256k1_gej *)r)->y).magnitude = iStack_208;
        (((secp256k1_gej *)r)->y).normalized = 0;
        goto LAB_0014f326;
      }
      goto LAB_0014fb23;
    }
  }
  else {
    pcStack_2b8 = (code *)0x14fb0a;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0014fb0a:
    pcStack_2b8 = (code *)0x14fb0f;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0014fb0f:
    pcStack_2b8 = (code *)0x14fb14;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0014fb14:
    pcStack_2b8 = (code *)0x14fb19;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_0014fb19:
    pcStack_2b8 = (code *)0x14fb1e;
    secp256k1_gej_add_zinv_var_cold_3();
  }
  pcStack_2b8 = (code *)0x14fb23;
  secp256k1_gej_add_zinv_var_cold_2();
LAB_0014fb23:
  pcStack_2b8 = secp256k1_fe_inv_var;
  secp256k1_gej_add_zinv_var_cold_1();
  pcStack_360 = (code *)0x14fb44;
  psStack_2e0 = (secp256k1_gej *)r;
  psStack_2d8 = a_01;
  uStack_2d0 = uVar17;
  psStack_2c8 = psVar19;
  psStack_2c0 = a_02;
  pcStack_2b8 = (code *)uVar12;
  secp256k1_fe_verify(&a_00->x);
  uVar12 = (a_00->x).n[4];
  lStack_350 = 0x1000003d1;
  uVar17 = (uVar12 >> 0x30) * 0x1000003d1 + (a_00->x).n[0];
  uVar18 = (uVar17 >> 0x34) + (a_00->x).n[1];
  uVar20 = (uVar18 >> 0x34) + (a_00->x).n[2];
  uVar9 = (uVar20 >> 0x34) + (a_00->x).n[3];
  uStack_348 = (uVar9 >> 0x34) + (uVar12 & 0xffffffffffff);
  uVar13 = (uVar17 ^ 0x1000003d0) & uVar18 & uVar20 & uVar9 & (uStack_348 ^ 0xf000000000000);
  pcStack_360 = (code *)0x14fbe1;
  secp256k1_fe_verify(&a_00->x);
  sStack_318.n[0] = (a_00->x).n[0];
  sStack_318.n[1] = (a_00->x).n[1];
  sStack_318.n[2] = (a_00->x).n[2];
  sStack_318.n[3] = (a_00->x).n[3];
  sStack_318.n[4] = (a_00->x).n[4];
  sStack_318.magnitude = (a_00->x).magnitude;
  sStack_318.normalized = (a_00->x).normalized;
  pcStack_360 = (code *)0x14fc0a;
  secp256k1_fe_normalize_var(&sStack_318);
  sStack_340.v[0] = (sStack_318.n[1] << 0x34 | sStack_318.n[0]) & 0x3fffffffffffffff;
  uVar15 = (ulong)((uint)sStack_318.n[2] & 0xfffff) << 0x2a | sStack_318.n[1] >> 10;
  sStack_340.v[2] = (ulong)((uint)sStack_318.n[3] & 0x3fffffff) << 0x20 | sStack_318.n[2] >> 0x14;
  sStack_340.v[3] = (sStack_318.n[4] & 0xffffffffff) << 0x16 | sStack_318.n[3] >> 0x1e;
  sStack_340.v[4] = sStack_318.n[4] >> 0x28;
  pcStack_360 = (code *)0x14fc9c;
  sStack_340.v[1] = uVar15;
  secp256k1_modinv64_var(&sStack_340,&secp256k1_const_modinfo_fe);
  pcStack_360 = (code *)0x14fca7;
  secp256k1_fe_from_signed62(&r_00->x,&sStack_340);
  (r_00->x).magnitude = (uint)(0 < (a_00->x).magnitude);
  (r_00->x).normalized = 1;
  pcStack_360 = (code *)0x14fcc3;
  secp256k1_fe_verify(&r_00->x);
  uVar12 = (r_00->x).n[4];
  psVar19 = (secp256k1_gej *)(uVar12 & 0xffffffffffff);
  uVar6 = (uVar12 >> 0x30) * lStack_350 + (r_00->x).n[0];
  uVar12 = (uVar6 >> 0x34) + (r_00->x).n[1];
  uVar11 = (uVar12 >> 0x34) + (r_00->x).n[2];
  uVar14 = (uVar11 >> 0x34) + (r_00->x).n[3];
  ng = (secp256k1_scalar *)((long)(psVar19->x).n + (uVar14 >> 0x34));
  uVar16 = (uVar6 ^ 0x1000003d0) & uVar12 & uVar11 & uVar14 & ((ulong)ng ^ 0xf000000000000);
  bVar7 = uVar16 == 0xfffffffffffff ||
          ((uVar12 | uVar6 | uVar11 | uVar14) & 0xfffffffffffff) == 0 &&
          ng == (secp256k1_scalar *)0x0;
  uVar10 = CONCAT71(0xfffffffffff,bVar7);
  uVar12 = (uVar18 | uVar17 | uVar20 | uVar9) & 0xfffffffffffff | uStack_348;
  if ((uVar13 != 0xfffffffffffff && uVar12 != 0) != bVar7) {
    secp256k1_fe_verify(&r_00->x);
    return;
  }
  pcStack_360 = secp256k1_ecmult_multi_simple_var;
  secp256k1_fe_inv_var_cold_1();
  psStack_388 = r_00;
  uStack_380 = uVar16;
  uStack_378 = uVar12;
  psStack_370 = a_00;
  psStack_368 = &sStack_340;
  pcStack_360 = (code *)uVar13;
  secp256k1_gej_set_infinity(psVar19);
  secp256k1_gej_set_infinity(&sStack_d60);
  sStack_df8.x.n[0] = (uint64_t)asStack_c60;
  sStack_df8.x.n[1] = (uint64_t)asStack_ae0;
  sStack_df8.x.n[2] = (uint64_t)&sStack_7a0;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_df8,psVar19,1,&sStack_d60,&secp256k1_scalar_zero,ng)
  ;
  if (uVar15 != 0) {
    uVar12 = 0;
    do {
      iVar5 = (*extraout_RDX)(&sStack_e18,&sStack_cc8,uVar12,uVar10);
      if (iVar5 == 0) {
        return;
      }
      secp256k1_gej_set_ge(&sStack_df8,&sStack_cc8);
      sStack_e30.aux = asStack_c60;
      sStack_e30.pre_a = asStack_ae0;
      sStack_e30.ps = &sStack_7a0;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_e30,&sStack_d60,1,&sStack_df8,&sStack_e18,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(psVar19,psVar19,&sStack_d60,(secp256k1_fe *)0x0);
      uVar12 = uVar12 + 1;
    } while (uVar15 != uVar12);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}